

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void vcm_print_error(char *format,__va_list_tag *args)

{
  uint uVar1;
  void *pvVar2;
  undefined8 *in_RSI;
  char *in_RDI;
  long *in_FS_OFFSET;
  char *tmp;
  int len;
  size_t msg_len;
  va_list ap;
  char buffer [1024];
  size_t in_stack_fffffffffffffb98;
  void *in_stack_fffffffffffffba0;
  size_t local_440;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  char local_408 [1024];
  long local_8;
  
  local_8 = in_FS_OFFSET[5];
  local_440 = 0;
  local_418 = in_RSI[2];
  local_428 = *in_RSI;
  uStack_420 = in_RSI[1];
  uVar1 = vsnprintf(local_408,0x400,in_RDI,in_RSI);
  if (-1 < (int)uVar1) {
    if (*(long *)(*in_FS_OFFSET + -0x110) == 0) {
      pvVar2 = libc_calloc((size_t)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      *(void **)(*in_FS_OFFSET + -0x110) = pvVar2;
      if (*(long *)(*in_FS_OFFSET + -0x110) == 0) goto LAB_0017129e;
    }
    else {
      local_440 = strlen(*(char **)(*in_FS_OFFSET + -0x110));
      pvVar2 = libc_realloc(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      if (pvVar2 == (void *)0x0) goto LAB_0017129e;
      *(void **)(*in_FS_OFFSET + -0x110) = pvVar2;
    }
    if (uVar1 < 0x400) {
      memcpy((void *)(*(long *)(*in_FS_OFFSET + -0x110) + local_440),local_408,
             (long)(int)(uVar1 + 1));
    }
    else {
      vsnprintf((char *)(*(long *)(*in_FS_OFFSET + -0x110) + local_440),(long)(int)uVar1,in_RDI,
                &local_428);
    }
  }
LAB_0017129e:
  if (in_FS_OFFSET[5] != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void vcm_print_error(const char* const format, va_list args)
{
    char buffer[1024];
    size_t msg_len = 0;
    va_list ap;
    int len;
    va_copy(ap, args);

    len = vsnprintf(buffer, sizeof(buffer), format, args);
    if (len < 0) {
        /* TODO */
        goto end;
    }

    if (cm_error_message == NULL) {
        /* CREATE MESSAGE */

        cm_error_message = libc_calloc(1, len + 1);
        if (cm_error_message == NULL) {
            /* TODO */
            goto end;
        }
    } else {
        /* APPEND MESSAGE */
        char *tmp;

        msg_len = strlen(cm_error_message);
        tmp = libc_realloc(cm_error_message, msg_len + len + 1);
        if (tmp == NULL) {
            goto end;
        }
        cm_error_message = tmp;
    }

    if (((size_t)len) < sizeof(buffer)) {
        /* Use len + 1 to also copy '\0' */
        memcpy(cm_error_message + msg_len, buffer, len + 1);
    } else {
        vsnprintf(cm_error_message + msg_len, len, format, ap);
    }
end:
    va_end(ap);

}